

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O1

_Bool check_hit(player *p,wchar_t to_hit)

{
  bitflag *flags;
  loc grid;
  loc grid_00;
  loc grid_01;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  
  iVar2 = (p->state).to_a + (p->state).ac;
  if (!character_dungeon) goto LAB_0016ea84;
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  _Var1 = square_isprotect(cave,grid);
  if (_Var1) {
    grid_00.x = (p->grid).x;
    grid_00.y = (p->grid).y;
    _Var1 = square_isorganic(cave,grid_00);
    if (_Var1) {
      flags = (p->state).pflags;
      _Var1 = flag_has_dbg(flags,10,0x30,"p->state.pflags","(PF_WOODSMAN)");
      if (!_Var1) {
        _Var1 = flag_has_dbg(flags,10,0x16,"p->state.pflags","(PF_ELVEN)");
        if (!_Var1) {
          iVar2 = iVar2 + iVar2 / 10 + 2;
          goto LAB_0016ea53;
        }
      }
      iVar3 = iVar2 + 7;
      if (-1 < iVar2) {
        iVar3 = iVar2;
      }
      iVar2 = iVar2 + (iVar3 >> 3) + 10;
    }
    else {
      iVar3 = iVar2 + 7;
      if (-1 < iVar2) {
        iVar3 = iVar2;
      }
      iVar2 = iVar2 + (iVar3 >> 3) + 5;
    }
  }
LAB_0016ea53:
  grid_01.x = (p->grid).x;
  grid_01.y = (p->grid).y;
  _Var1 = square_isexpose(cave,grid_01);
  if (_Var1) {
    iVar3 = (int)((ulong)((long)iVar2 * 0x55555555) >> 0x20) - iVar2;
    iVar2 = ((iVar3 >> 1) - (iVar3 >> 0x1f)) + iVar2;
  }
LAB_0016ea84:
  equip_learn_on_defend(p);
  iVar3 = iVar2 * 3 + 3;
  if (-1 < iVar2 * 3) {
    iVar3 = iVar2 * 3;
  }
  _Var1 = test_hit(to_hit,iVar3 >> 2);
  return _Var1;
}

Assistant:

bool check_hit(struct player *p, int to_hit)
{
	int ac = p->state.ac + p->state.to_a;

	/* Players can take advantage of cover. */
	if (character_dungeon) {
		if (square_isprotect(cave, p->grid)) {
			/* Players in trees can take advantage of cover, especially elves, 
			 * rangers and druids. */
			if (square_isorganic(cave, p->grid)) {
				if (player_has(p, PF_WOODSMAN) || player_has(p, PF_ELVEN)) {
					ac += ac / 8 + 10;
				} else {
					ac += ac / 10 + 2;
				}
			} else {
				/* Players in rubble can take advantage of cover. */
				ac += ac / 8 + 5;
			}
		}

		/* Players can be vulnerable. */
		if (square_isexpose(cave, p->grid)) {
			ac -= ac / 3;
		}
	}

	/* If anything checks vs ac, the player learns ac bonuses */
	equip_learn_on_defend(p);

	/* Check if the player was hit */
	return test_hit(to_hit, (ac * 3) / 4);
}